

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::ByteSizeLong
          (CustomModel_CustomModelParamValue *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  size_t sVar7;
  bool bVar8;
  
  uVar1 = this->_oneof_case_[0];
  sVar7 = 0;
  if ((int)uVar1 < 0x28) {
    if (uVar1 == 10) {
      sVar7 = 9;
      goto LAB_002ae127;
    }
    bVar8 = uVar1 == 0x14;
    if (!bVar8) {
      if (uVar1 == 0x1e) {
        if ((this->value_).intvalue_ < 0) {
          sVar7 = 0xc;
        }
        else {
          uVar4 = (this->value_).intvalue_ | 1;
          iVar2 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          sVar7 = (size_t)((iVar2 * 9 + 0x49U >> 6) + 2);
        }
      }
      goto LAB_002ae127;
    }
  }
  else {
    if (uVar1 == 0x28) {
      uVar5 = (this->value_).longvalue_ | 1;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar7 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
      goto LAB_002ae127;
    }
    if (uVar1 == 0x32) {
      sVar7 = 3;
      goto LAB_002ae127;
    }
    bVar8 = uVar1 == 0x3c;
    if (!bVar8) goto LAB_002ae127;
  }
  if (bVar8) {
    puVar6 = (undefined8 *)(this->value_).longvalue_;
  }
  else {
    puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  uVar4 = (uint)puVar6[1] | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar7 = puVar6[1] + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_002ae127:
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

inline CustomModel_CustomModelParamValue::ValueCase CustomModel_CustomModelParamValue::value_case() const {
  return CustomModel_CustomModelParamValue::ValueCase(_oneof_case_[0]);
}